

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O2

SRC_ERROR sinc_stereo_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  float fVar2;
  SINC_FILTER *filter;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  int ch;
  SRC_ERROR SVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int half_filter_chan_len;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int divisor;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double local_78 [5];
  SRC_DATA *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar6 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar13 = state->channels;
    uVar12 = (ulong)iVar13;
    filter->in_count = data->input_frames * uVar12;
    lVar15 = data->output_frames * uVar12;
    filter->out_count = lVar15;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar22 = state->last_ratio;
    SVar6 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar22) && (dVar22 <= 256.0)) {
      dVar23 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar20 = dVar22;
      if (data->src_ratio <= dVar22) {
        dVar20 = data->src_ratio;
      }
      dVar21 = state->last_position;
      half_filter_chan_len =
           ((int)ROUND((double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar23 / dVar20) |
                               ~-(ulong)(dVar20 < 1.0) & (ulong)dVar23)) + 1) * iVar13;
      dVar20 = dVar21 - (double)(int)ROUND(dVar21);
      dVar20 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                       (ulong)(dVar20 + 1.0) & -(ulong)(dVar20 < 0.0));
      iVar17 = filter->b_len;
      lVar16 = (long)((int)ROUND(dVar21 - dVar20) * iVar13 + filter->b_current) % (long)iVar17;
      local_48 = 1.0 / dVar22 + 1e-20;
      filter->b_current = (int)lVar16;
      lVar14 = 0;
      local_50 = data;
      while (iVar13 = (int)lVar16, lVar14 < lVar15) {
        if (((filter->b_end - iVar13) + iVar17) % iVar17 <= half_filter_chan_len) {
          SVar6 = prepare_data(filter,(int)uVar12,data,half_filter_chan_len);
          state->error = SVar6;
          if (SVar6 != SRC_ERR_NO_ERROR) {
            return SVar6;
          }
          iVar13 = filter->b_current;
          if (((filter->b_end - iVar13) + filter->b_len) % filter->b_len <= half_filter_chan_len)
          break;
        }
        if ((-1 < filter->b_real_end) &&
           ((double)filter->b_real_end <= (double)iVar13 + dVar20 + local_48)) break;
        if (filter->out_count < 1) {
          lVar15 = filter->out_gen;
        }
        else {
          dVar23 = state->last_ratio;
          lVar15 = filter->out_gen;
          if (1e-10 < ABS(dVar23 - data->src_ratio)) {
            dVar22 = ((data->src_ratio - dVar23) * (double)lVar15) / (double)filter->out_count +
                     dVar23;
          }
        }
        dVar21 = (double)filter->index_inc;
        dVar23 = dVar22;
        if (1.0 <= dVar22) {
          dVar23 = 1.0;
        }
        dVar23 = dVar23 * dVar21;
        divisor = (int)ROUND(dVar23 * 4096.0);
        iVar18 = (int)ROUND(dVar20 * dVar23 * 4096.0);
        iVar17 = state->channels;
        pfVar3 = data->data_out;
        iVar7 = filter->coeff_half_len * 0x1000;
        iVar8 = (iVar7 - iVar18) / divisor;
        uVar11 = iVar8 * divisor + iVar18;
        uVar19 = iVar13 - iVar8 * iVar17;
        if ((int)uVar19 < 0) {
          local_40 = dVar21;
          local_38 = dVar23;
          uVar9 = int_div_ceil(-uVar19,2);
          uVar10 = int_div_ceil(uVar11,divisor);
          if (uVar10 < uVar9) {
            __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x21d,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          uVar11 = uVar11 - uVar9 * divisor;
          uVar19 = uVar19 + uVar9 * 2;
          data = local_50;
          dVar23 = local_38;
          dVar21 = local_40;
        }
        uVar12 = (ulong)uVar19;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        lVar16 = uVar12 * 4;
        for (; -1 < (int)uVar11; uVar11 = uVar11 - divisor) {
          uVar9 = uVar11 >> 0xc;
          if (filter->coeff_half_len < (int)uVar9) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x225,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if (((int)uVar19 < 0) || (iVar13 = (int)uVar12 + 1, filter->b_len <= iVar13)) {
            __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x227,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if (filter->b_end <= iVar13) {
            __assert_fail("data_index + 1 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x228,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar9];
          fVar2 = filter->coeffs[(ulong)uVar9 + 1];
          pfVar4 = filter->buffer;
          for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
            local_78[lVar14 + 2] =
                 (double)*(float *)((long)pfVar4 + lVar14 * 4 + lVar16) *
                 ((double)(uVar11 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + local_78[lVar14 + 2];
          }
          uVar12 = uVar12 + 2;
          lVar16 = lVar16 + 8;
        }
        iVar7 = (iVar7 - (divisor - iVar18)) / divisor;
        iVar13 = filter->b_current;
        uVar11 = (iVar7 + 1) * iVar17 + iVar13;
        local_78[0] = 0.0;
        local_78[1] = 0.0;
        uVar19 = iVar7 * divisor + (divisor - iVar18);
        do {
          uVar9 = (int)uVar19 >> 0xc;
          if (((int)uVar9 < 0) || (filter->coeff_half_len < (int)uVar9)) {
            __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x23a,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          if ((int)uVar11 < 0) {
LAB_00103a46:
            __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x23c,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          iVar17 = filter->b_len;
          if (iVar17 <= (int)(uVar11 + 1)) goto LAB_00103a46;
          if (filter->b_end <= (int)(uVar11 + 1)) {
            __assert_fail("data_index + 1 < filter->b_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                          ,0x23d,
                          "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                         );
          }
          fVar1 = filter->coeffs[uVar9];
          fVar2 = filter->coeffs[(ulong)uVar9 + 1];
          pfVar4 = filter->buffer;
          for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
            local_78[lVar16] =
                 (double)pfVar4[(ulong)uVar11 + lVar16] *
                 ((double)(uVar19 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + local_78[lVar16];
          }
          uVar11 = uVar11 - 2;
          uVar9 = uVar19 - divisor;
          bVar5 = divisor <= (int)uVar19;
          uVar19 = uVar9;
        } while (uVar9 != 0 && bVar5);
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          pfVar3[lVar15 + lVar16] =
               (float)((local_78[lVar16 + 2] + local_78[lVar16]) * (dVar23 / dVar21));
        }
        lVar15 = filter->out_count;
        lVar14 = filter->out_gen + 2;
        dVar23 = dVar20 + 1.0 / dVar22;
        filter->out_gen = lVar14;
        dVar20 = dVar23 - (double)(int)ROUND(dVar23);
        dVar20 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                         (ulong)(dVar20 + 1.0) & -(ulong)(dVar20 < 0.0));
        uVar12 = (ulong)(uint)state->channels;
        lVar16 = (long)((int)ROUND(dVar23 - dVar20) * state->channels + iVar13) % (long)iVar17;
        filter->b_current = (int)lVar16;
      }
      state->last_position = dVar20;
      state->last_ratio = dVar22;
      iVar13 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar13;
      data->output_frames_gen = filter->out_gen / (long)iVar13;
      SVar6 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar6;
}

Assistant:

SRC_ERROR
sinc_stereo_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_stereo (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 2 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}